

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

int ftp_domore_getsock(Curl_easy *data,connectdata *conn,curl_socket_t *socks)

{
  int iVar1;
  uint uVar2;
  int i;
  long lVar3;
  bool bVar4;
  
  if ((conn->cnnct).state - CONNECT_SOCKS_INIT < 0x10) {
    iVar1 = Curl_SOCKS_getsock(conn,socks,1);
    return iVar1;
  }
  if ((conn->proto).ftpc.state == FTP_STOP) {
    *socks = conn->sock[0];
    if (((data->set).field_0x8e3 & 4) == 0) {
      uVar2 = 1;
      bVar4 = false;
      iVar1 = 1;
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        if (conn->tempsock[lVar3] != -1) {
          socks[iVar1] = conn->tempsock[lVar3];
          uVar2 = uVar2 | 1 << ((byte)((char)iVar1 + 0x10) & 0x1f);
          bVar4 = true;
          iVar1 = iVar1 + 1;
        }
      }
      if (bVar4) {
        return uVar2;
      }
    }
    else {
      uVar2 = 1;
    }
    socks[1] = conn->sock[1];
    return uVar2 | 0x20002;
  }
  iVar1 = Curl_pp_getsock(data,&(conn->proto).ftpc.pp,socks);
  return iVar1;
}

Assistant:

static int ftp_domore_getsock(struct Curl_easy *data,
                              struct connectdata *conn, curl_socket_t *socks)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  (void)data;

  /* When in DO_MORE state, we could be either waiting for us to connect to a
   * remote site, or we could wait for that site to connect to us. Or just
   * handle ordinary commands.
   */

  if(SOCKS_STATE(conn->cnnct.state))
    return Curl_SOCKS_getsock(conn, socks, SECONDARYSOCKET);

  if(FTP_STOP == ftpc->state) {
    int bits = GETSOCK_READSOCK(0);
    bool any = FALSE;

    /* if stopped and still in this state, then we're also waiting for a
       connect on the secondary connection */
    socks[0] = conn->sock[FIRSTSOCKET];

    if(!data->set.ftp_use_port) {
      int s;
      int i;
      /* PORT is used to tell the server to connect to us, and during that we
         don't do happy eyeballs, but we do if we connect to the server */
      for(s = 1, i = 0; i<2; i++) {
        if(conn->tempsock[i] != CURL_SOCKET_BAD) {
          socks[s] = conn->tempsock[i];
          bits |= GETSOCK_WRITESOCK(s++);
          any = TRUE;
        }
      }
    }
    if(!any) {
      socks[1] = conn->sock[SECONDARYSOCKET];
      bits |= GETSOCK_WRITESOCK(1) | GETSOCK_READSOCK(1);
    }

    return bits;
  }
  return Curl_pp_getsock(data, &conn->proto.ftpc.pp, socks);
}